

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::AddVariantChildrenToPrimNode
          (Impl *this,int32_t prim_idx,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *variantChildren)

{
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__x;
  size_type sVar1;
  ostream *poVar2;
  mapped_type *this_00;
  key_type_conflict1 local_1cc;
  string local_1c8;
  ostringstream local_1a8 [8];
  ostringstream ss_w;
  key_type_conflict1 local_2c;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *local_28;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *variantChildren_local;
  Impl *pIStack_18;
  int32_t prim_idx_local;
  Impl *this_local;
  
  if (prim_idx < 0) {
    this_local._7_1_ = false;
  }
  else {
    local_2c = prim_idx;
    local_28 = variantChildren;
    variantChildren_local._4_4_ = prim_idx;
    pIStack_18 = this;
    sVar1 = ::std::
            map<unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>_>_>
            ::count(&this->_variantChildren,&local_2c);
    if (sVar1 != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"AddVariantChildrenToPrimNode");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x17f);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1a8,
                                 "Multiple Field with VariantSet SpecType detected.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushWarn(this,&local_1c8);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
    __x = local_28;
    local_1cc = variantChildren_local._4_4_;
    this_00 = ::std::
              map<unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>_>_>
              ::operator[](&this->_variantChildren,&local_1cc);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)this_00,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)__x);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AddVariantChildrenToPrimNode(
      int32_t prim_idx, const std::vector<value::token> &variantChildren) {
    if (prim_idx < 0) {
      return false;
    }

    if (_variantChildren.count(uint32_t(prim_idx))) {
      PUSH_WARN("Multiple Field with VariantSet SpecType detected.");
    }

    _variantChildren[uint32_t(prim_idx)] = variantChildren;

    return true;
  }